

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O0

void __thiscall ZXing::Content::switchEncoding(Content *this,ECI eci,bool isECI)

{
  byte bVar1;
  byte in_DL;
  vector<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_> *in_RDI;
  value_type *__x;
  
  bVar1 = in_DL & 1;
  if ((bVar1 != 0) &&
     (((ulong)(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &in_RDI[2].
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl)->_M_impl).super__Vector_impl_data._M_start & 0x10000000000) == 0)) {
    std::vector<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>::clear
              ((vector<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_> *)
               0x22065f);
  }
  if ((bVar1 != 0) ||
     (((ulong)(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &in_RDI[2].
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl)->_M_impl).super__Vector_impl_data._M_start & 0x10000000000) == 0)) {
    __x = (value_type *)(in_RDI + 1);
    Size<ZXing::ByteArray>((ByteArray *)in_RDI);
    std::vector<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>::push_back
              (in_RDI,__x);
  }
  *(bool *)((long)&(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &in_RDI[2].
                     super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                     ._M_impl)->_M_impl).super__Vector_impl_data._M_start + 5) =
       ((ulong)(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                &in_RDI[2].
                 super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                 ._M_impl)->_M_impl).super__Vector_impl_data._M_start & 0x10000000000) != 0 ||
       bVar1 != 0;
  return;
}

Assistant:

void Content::switchEncoding(ECI eci, bool isECI)
{
	// remove all non-ECI entries on first ECI entry
	if (isECI && !hasECI)
		encodings.clear();
	if (isECI || !hasECI)
		encodings.push_back({eci, Size(bytes)});

	hasECI |= isECI;
}